

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DummyTest.cpp
# Opt level: O3

void __thiscall DummyTest_Size_Test::TestBody(DummyTest_Size_Test *this)

{
  int iVar1;
  bool bVar2;
  char *message;
  AssertionResult gtest_ar;
  Deque<int,_std::allocator<int>_> d;
  value_type local_ec;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  AssertHelper local_e0;
  allocator<int> local_d8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  Deque<int,_std::allocator<int>_> local_c8;
  
  Deque<int,_std::allocator<int>_>::Deque(&local_c8,local_d8);
  local_ec = 0;
  do {
    Deque<int,_std::allocator<int>_>::push_back(&local_c8,&local_ec);
    local_e8.ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         Deque<int,_std::allocator<int>_>::size(&local_c8);
    local_e0.data_._0_4_ = local_ec + 1;
    testing::internal::CmpHelperEQ<unsigned_long,int>
              ((internal *)local_d8,"d.size()","i + 1",(unsigned_long *)&local_e8,(int *)&local_e0);
    if (local_d8[0] == (allocator<int>)0x0) {
      testing::Message::Message((Message *)&local_e8);
      if (local_d0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        message = "";
      }
      else {
        message = ((local_d0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ogorodnikoff2012[P]Deque/tests/DummyTest.cpp"
                 ,0x16,message);
      testing::internal::AssertHelper::operator=(&local_e0,(Message *)&local_e8);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      if (((local_e8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         (local_e8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_e8.ptr_ + 8))();
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      break;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_d0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar1 = local_ec + 1;
    bVar2 = local_ec < 99;
    local_ec = iVar1;
  } while (bVar2);
  Deque<int,_std::allocator<int>_>::~Deque(&local_c8);
  return;
}

Assistant:

TEST(DummyTest, Size) {
    Deque<int> d;
    for (int i = 0; i < 100; ++i) {
        d.push_back(i);
        ASSERT_EQ(d.size(), i + 1);
    }
}